

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

cram_fd * cram_dopen(hFILE *fp,char *filename,char *mode)

{
  ushort uVar1;
  char cVar2;
  int iVar3;
  cram_fd *fd;
  cram_file_def *pcVar4;
  SAM_hdr *pSVar5;
  long lVar6;
  char *pcVar7;
  refs_t *prVar8;
  cram_metrics *pcVar9;
  char *pcVar10;
  uint uVar11;
  SAM_hdr *h;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  char (*__s) [32];
  
  fd = (cram_fd *)calloc(1,0x8900);
  if (fd == (cram_fd *)0x0) {
    return (cram_fd *)0x0;
  }
  fd->level = 5;
  cVar2 = *mode;
  if (cVar2 != '\0') {
    pcVar10 = mode + 1;
    do {
      if ((byte)(cVar2 - 0x30U) < 10) {
        fd->level = (uint)(byte)(cVar2 - 0x30U);
        break;
      }
      cVar2 = *pcVar10;
      pcVar10 = pcVar10 + 1;
    } while (cVar2 != '\0');
  }
  fd->fp = fp;
  cVar2 = *mode;
  fd->mode = (int)cVar2;
  fd->first_container = 0;
  if (cVar2 == 0x72) {
    pcVar4 = cram_read_file_def(fd);
    fd->file_def = pcVar4;
    if (pcVar4 == (cram_file_def *)0x0) goto LAB_00128f79;
    uVar1._0_1_ = pcVar4->major_version;
    uVar1._1_1_ = pcVar4->minor_version;
    fd->version = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
    pSVar5 = cram_read_SAM_hdr(fd);
    fd->header = pSVar5;
    if (pSVar5 == (SAM_hdr *)0x0) goto LAB_00128f79;
  }
  else {
    pcVar4 = (cram_file_def *)calloc(1,0x1a);
    if (pcVar4 == (cram_file_def *)0x0) {
      return (cram_fd *)0x0;
    }
    fd->file_def = pcVar4;
    builtin_strncpy(pcVar4->magic,"CRAM",4);
    pcVar4->major_version = '\0';
    pcVar4->minor_version = '\0';
    pcVar4->file_id[0] = '\0';
    pcVar4->file_id[1] = '\0';
    pcVar4->file_id[2] = '\0';
    pcVar4->file_id[3] = '\0';
    pcVar4->file_id[4] = '\0';
    pcVar4->file_id[5] = '\0';
    pcVar4->file_id[6] = '\0';
    pcVar4->file_id[7] = '\0';
    pcVar4->file_id[8] = '\0';
    pcVar4->file_id[9] = '\0';
    pcVar4->file_id[10] = '\0';
    pcVar4->file_id[0xb] = '\0';
    pcVar4->file_id[0xc] = '\0';
    pcVar4->file_id[0xd] = '\0';
    pcVar4->file_id[0xc] = '\0';
    pcVar4->file_id[0xd] = '\0';
    pcVar4->file_id[0xe] = '\0';
    pcVar4->file_id[0xf] = '\0';
    pcVar4->file_id[0x10] = '\0';
    pcVar4->file_id[0x11] = '\0';
    pcVar4->file_id[0x12] = '\0';
    pcVar4->file_id[0x13] = '\0';
    strncpy(pcVar4->file_id,filename,0x14);
    fd->version = 0x201;
  }
  memset(fd->L1,4,0x100);
  uVar17 = 0;
  fd->L1[0x41] = '\0';
  fd->L1[0x61] = '\0';
  fd->L1[0x43] = '\x01';
  fd->L1[99] = '\x01';
  fd->L1[0x47] = '\x02';
  fd->L1[0x67] = '\x02';
  fd->L1[0x54] = '\x03';
  fd->L1[0x74] = '\x03';
  memset(fd->L2,5,0x100);
  fd->L2[0x41] = '\0';
  fd->L2[0x61] = '\0';
  fd->L2[0x43] = '\x01';
  fd->L2[99] = '\x01';
  fd->L2[0x47] = '\x02';
  fd->L2[0x67] = '\x02';
  fd->L2[0x54] = '\x03';
  fd->L2[0x74] = '\x03';
  fd->L2[0x4e] = '\x04';
  fd->L2[0x6e] = '\x04';
  if ((fd->version & 0xffffff00U) == 0x100) {
    uVar11 = 0;
    uVar12 = 0;
    uVar14 = 0;
    uVar15 = 0;
    uVar16 = 0;
    do {
      fd->bam_flag_swap[uVar16] =
           uVar15 & 0x400 | uVar14 & 0x200 |
           uVar12 & 0x100 |
           uVar11 & 0x80 |
           uVar17 & 0x40 |
           (uint)(uVar16 >> 1) & 0x10 |
           (uint)(uVar16 >> 4) & 4 | (uint)(uVar16 >> 6) & 2 | (uint)(0xff < uVar16);
      uVar16 = uVar16 + 1;
      uVar15 = uVar15 + 0x400;
      uVar14 = uVar14 + 0x100;
      uVar12 = uVar12 + 0x40;
      uVar11 = uVar11 + 0x10;
      uVar17 = uVar17 + 4;
    } while (uVar16 != 0x200);
    uVar17 = 0;
    uVar16 = 0;
    do {
      uVar11 = (uint)(ushort)(((ushort)uVar16 & 7) << 8) << 4;
      uVar11 = (uVar11 >> 2 & 0x3333) + (uVar11 & 0x3333) * 4;
      fd->cram_flag_swap[uVar16] =
           (uint)(uVar16 >> 10) & 1 |
           (uint)(uVar16 >> 8) & 2 |
           (uint)(uVar16 >> 6) & 4 |
           (uint)(uVar16 >> 4) & 8 | (uint)(uVar16 >> 2) & 0x10 | uVar17 & 0x20 |
           (uVar11 >> 1 & 0x5500) + (uVar11 & 0x5540) * 2 >> 7;
      uVar16 = uVar16 + 1;
      uVar17 = uVar17 + 2;
    } while (uVar16 != 0x1000);
  }
  else {
    lVar6 = 0;
    do {
      fd->bam_flag_swap[lVar6] = (uint)lVar6;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x1000);
    lVar6 = 0;
    do {
      fd->cram_flag_swap[lVar6] = (uint)lVar6;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x1000);
  }
  __s = fd->cram_sub_matrix;
  memset(__s,4,0x400);
  lVar6 = 0x8435;
  do {
    *(undefined1 *)((long)fd->m + lVar6 + -0x80) = 0;
    *(undefined1 *)((long)fd->m + lVar6 + -0x7e) = 1;
    *(undefined1 *)((long)fd->m + lVar6 + -0x7a) = 2;
    *(undefined1 *)((long)fd->m + lVar6 + -0x6d) = 3;
    *(undefined1 *)((long)fd->m + lVar6 + -0x73) = 4;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0x8835);
  uVar16 = 0xfffffffffffffffc;
  pcVar10 = "ACGTN";
  do {
    uVar13 = (ulong)(((byte)*pcVar10 & 0x1f) << 5);
    builtin_strncpy(*__s + uVar13,
                    "\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03"
                    ,0x14);
    (*__s)[((byte)"CGTNAGTNACTNACGNACGT"[uVar16 + 4] & 0x1f) + uVar13] = '\0';
    (*__s)[((byte)"CGTNAGTNACTNACGNACGT"[uVar16 + 5] & 0x1f) + uVar13] = '\x01';
    (*__s)[((byte)"CGTNAGTNACTNACGNACGT"[uVar16 + 6] & 0x1f) + uVar13] = '\x02';
    (*__s)[((byte)"CGTNAGTNACTNACGNACGT"[uVar16 + 7] & 0x1f) + uVar13] = '\x03';
    uVar16 = uVar16 + 4;
    pcVar10 = (char *)((byte *)pcVar10 + 1);
  } while (uVar16 < 0x10);
  pcVar7 = strrchr(filename,0x2f);
  pcVar10 = pcVar7 + 1;
  if (pcVar7 == (char *)0x0) {
    pcVar10 = filename;
  }
  pcVar10 = strdup(pcVar10);
  fd->prefix = pcVar10;
  if (pcVar10 != (char *)0x0) {
    fd->first_base = -1;
    fd->last_base = -1;
    fd->record_counter = 0;
    fd->ctr = (cram_container *)0x0;
    prVar8 = refs_create();
    fd->refs = prVar8;
    if (prVar8 != (refs_t *)0x0) {
      fd->ref_id = -2;
      fd->ref = (char *)0x0;
      fd->decode_md = 0;
      fd->verbose = 0;
      fd->seqs_per_slice = 10000;
      fd->slices_per_container = 1;
      fd->embed_ref = 0;
      fd->no_ref = 0;
      fd->ignore_md5 = 0;
      fd->use_bz2 = 0;
      fd->use_rans = (uint)(0x2ff < fd->version);
      fd->use_lzma = 0;
      fd->shared_ref = 0;
      fd->multi_seq = -1;
      fd->unsorted = 0;
      fd->index = (cram_index *)0x0;
      fd->job_pending = (void *)0x0;
      fd->ooc = 0;
      *(undefined8 *)&fd->own_pool = 0;
      *(undefined8 *)((long)&fd->pool + 4) = 0;
      *(undefined4 *)((long)&fd->rqueue + 4) = 0;
      fd->required_fields = 0x7fffffff;
      lVar6 = 0x10;
      do {
        pcVar9 = (cram_metrics *)calloc(1,0x78);
        if (pcVar9 == (cram_metrics *)0x0) {
          pcVar9 = (cram_metrics *)0x0;
        }
        else {
          pcVar9->trial = 2;
          pcVar9->next_trial = 0x32;
          pcVar9->method = 0;
          pcVar9->strat = 0;
          pcVar9->revised_method = 0;
        }
        fd->m[lVar6 + -0x10] = pcVar9;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x3f);
      (fd->range).refid = -2;
      fd->eof = 1;
      fd->ref_fn = (char *)0x0;
      fd->bl = (spare_bams *)0x0;
      iVar3 = refs_from_header(fd->refs,(cram_fd *)fd->header,h);
      if (iVar3 != -1) {
        return fd;
      }
    }
  }
LAB_00128f79:
  free(fd);
  return (cram_fd *)0x0;
}

Assistant:

cram_fd *cram_dopen(hFILE *fp, const char *filename, const char *mode) {
    int i;
    char *cp;
    cram_fd *fd = calloc(1, sizeof(*fd));
    if (!fd)
	return NULL;

    fd->level = 5;
    for (i = 0; mode[i]; i++) {
	if (mode[i] >= '0' && mode[i] <= '9') {
	    fd->level = mode[i] - '0';
	    break;
	}
    }

    fd->fp = fp;
    fd->mode = *mode;
    fd->first_container = 0;

    if (fd->mode == 'r') {
	/* Reader */

	if (!(fd->file_def = cram_read_file_def(fd)))
	    goto err;

	fd->version = fd->file_def->major_version * 256 +
	    fd->file_def->minor_version;

	if (!(fd->header = cram_read_SAM_hdr(fd)))
	    goto err;

    } else {
	/* Writer */
	cram_file_def *def = calloc(1, sizeof(*def));
	if (!def)
	    return NULL;

	fd->file_def = def;

	def->magic[0] = 'C';
	def->magic[1] = 'R';
	def->magic[2] = 'A';
	def->magic[3] = 'M';
	def->major_version = 0; // Indicator to write file def later.
	def->minor_version = 0;
	memset(def->file_id, 0, 20);
	strncpy(def->file_id, filename, 20);

	fd->version = major_version * 256 + minor_version;

	/* SAM header written later along with this file_def */
    }

    cram_init_tables(fd);

    fd->prefix = strdup((cp = strrchr(filename, '/')) ? cp+1 : filename);
    if (!fd->prefix)
	goto err;
    fd->first_base = fd->last_base = -1;
    fd->record_counter = 0;

    fd->ctr = NULL;
    fd->refs  = refs_create();
    if (!fd->refs)
	goto err;
    fd->ref_id = -2;
    fd->ref = NULL;

    fd->decode_md = 0;
    fd->verbose = 0;
    fd->seqs_per_slice = SEQS_PER_SLICE;
    fd->slices_per_container = SLICE_PER_CNT;
    fd->embed_ref = 0;
    fd->no_ref = 0;
    fd->ignore_md5 = 0;
    fd->use_bz2 = 0;
    fd->use_rans = (CRAM_MAJOR_VERS(fd->version) >= 3);
    fd->use_lzma = 0;
    fd->multi_seq = -1;
    fd->unsorted   = 0;
    fd->shared_ref = 0;

    fd->index       = NULL;
    fd->own_pool    = 0;
    fd->pool        = NULL;
    fd->rqueue      = NULL;
    fd->job_pending = NULL;
    fd->ooc         = 0;
    fd->required_fields = INT_MAX;

    for (i = 0; i < DS_END; i++)
	fd->m[i] = cram_new_metrics();

    fd->range.refid = -2; // no ref.
    fd->eof = 1;          // See samtools issue #150
    fd->ref_fn = NULL;

    fd->bl = NULL;

    /* Initialise dummy refs from the @SQ headers */
    if (-1 == refs_from_header(fd->refs, fd, fd->header))
	goto err;

    return fd;

 err:
    if (fd)
	free(fd);

    return NULL;
}